

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O0

QSqlDatabase QSqlDatabasePrivate::database(QString *name,bool open)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  Type *__file;
  QString *t;
  QString *pQVar4;
  byte in_DL;
  int __oflag;
  QSqlDatabasePrivate *in_RDI;
  long in_FS_OFFSET;
  QSqlDatabase db;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_fffffffffffffef8;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  QSqlDatabasePrivate *this;
  char *in_stack_ffffffffffffff48;
  QDebug local_88;
  char local_80 [32];
  QSqlDatabase local_60;
  char local_58 [32];
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = QCoreApplication::instanceExists();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_60.d = (QSqlDatabasePrivate *)0xaaaaaaaaaaaaaaaa;
    __file = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
             ::operator()((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_s_sqlGlobals>_>
                           *)in_stack_fffffffffffffef8);
    anon_unknown.dwarf_4455c::QtSqlGlobals::connection((QtSqlGlobals *)this,(QString *)in_RDI);
    bVar2 = QSqlDatabase::isValid((QSqlDatabase *)in_RDI);
    if (bVar2) {
      QSqlDatabase::driver(&local_60);
      t = (QString *)QObject::thread();
      pQVar4 = (QString *)QThread::currentThread();
      if (t == pQVar4) {
        if ((((in_DL & 1) != 0) && (bVar2 = QSqlDatabase::isOpen((QSqlDatabase *)0x11cb95), !bVar2))
           && (uVar3 = QSqlDatabase::open(&local_60,(char *)__file,__oflag), (uVar3 & 1) == 0)) {
          local_38 = 0xaaaaaaaaaaaaaaaa;
          local_30 = 0xaaaaaaaaaaaaaaaa;
          lcSqlDb();
          anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
            anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11cc08);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_RDI,(char *)t,
                       (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                       (char *)in_stack_fffffffffffffef8,(char *)0x11cc1e);
            QMessageLogger::warning();
            in_stack_ffffffffffffff00 =
                 (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffff48);
            QSqlDatabase::lastError((QSqlDatabase *)in_stack_fffffffffffffef8);
            QSqlError::text((QSqlError *)this);
            QDebug::operator<<((QDebug *)in_RDI,t);
            QString::~QString((QString *)0x11cc83);
            QSqlError::~QSqlError((QSqlError *)0x11cc8d);
            QDebug::~QDebug(&local_88);
            local_30 = local_30 & 0xffffffffffffff00;
          }
        }
        QSqlDatabase::QSqlDatabase
                  ((QSqlDatabase *)in_stack_ffffffffffffff00,
                   (QSqlDatabase *)in_stack_fffffffffffffef8);
      }
      else {
        local_28 = 0xaaaaaaaaaaaaaaaa;
        local_20 = 0xaaaaaaaaaaaaaaaa;
        lcSqlDb();
        anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
          anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11cb2d);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_RDI,(char *)t,
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (char *)in_stack_fffffffffffffef8,(char *)0x11cb46);
          QMessageLogger::warning
                    (local_80,
                     "QSqlDatabasePrivate::database: requested database does not belong to the calling thread."
                    );
          local_20 = local_20 & 0xffffffffffffff00;
        }
        QSqlDatabase::QSqlDatabase((QSqlDatabase *)in_stack_ffffffffffffff00);
      }
    }
    else {
      QSqlDatabase::QSqlDatabase
                ((QSqlDatabase *)in_stack_ffffffffffffff00,(QSqlDatabase *)in_stack_fffffffffffffef8
                );
    }
    QSqlDatabase::~QSqlDatabase((QSqlDatabase *)in_stack_ffffffffffffff00);
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    lcSqlDb();
    anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
      anon_unknown.dwarf_4455c::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x11ca02);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,in_stack_ffffffffffffff08,
                 (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(char *)in_stack_fffffffffffffef8,
                 (char *)0x11ca1b);
      QMessageLogger::warning(local_58,"QSqlDatabase requires a QCoreApplication");
      local_10 = local_10 & 0xffffffffffffff00;
    }
    QSqlDatabase::QSqlDatabase((QSqlDatabase *)in_stack_ffffffffffffff00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QSqlDatabase)this;
}

Assistant:

QSqlDatabase QSqlDatabasePrivate::database(const QString& name, bool open)
{
    CHECK_QCOREAPPLICATION_RETVAL
    QSqlDatabase db = s_sqlGlobals()->connection(name);
    if (!db.isValid())
        return db;
    if (db.driver()->thread() != QThread::currentThread()) {
        qCWarning(lcSqlDb, "QSqlDatabasePrivate::database: requested database does not belong to the calling thread.");
        return QSqlDatabase();
    }

    if (open && !db.isOpen()) {
        if (!db.open())
            qCWarning(lcSqlDb) << "QSqlDatabasePrivate::database: unable to open database:" << db.lastError().text();

    }
    return db;
}